

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O2

Vec_Wec_t * Gia_ManCreateSupps(Gia_Man_t *p,int fVerbose)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  uint uVar6;
  abctime aVar7;
  Vec_Wec_t *p_00;
  Gia_Obj_t *pGVar8;
  Vec_Int_t *pVVar9;
  Vec_Int_t *pVVar10;
  Vec_Int_t *p_01;
  ulong uVar11;
  abctime aVar12;
  int *piVar13;
  abctime time;
  int iVar14;
  int *piVar15;
  int *piVar16;
  
  aVar7 = Abc_Clock();
  p_00 = Vec_WecStart(p->nObjs);
  for (iVar14 = 0; iVar14 < p->vCis->nSize; iVar14 = iVar14 + 1) {
    pGVar8 = Gia_ManCi(p,iVar14);
    iVar5 = Gia_ObjId(p,pGVar8);
    if (iVar5 == 0) break;
    pVVar9 = Vec_WecEntry(p_00,iVar5);
    Vec_IntPush(pVVar9,iVar14);
  }
  iVar14 = 0;
  do {
    if ((p->nObjs <= iVar14) || (pGVar8 = Gia_ManObj(p,iVar14), pGVar8 == (Gia_Obj_t *)0x0)) {
      if (fVerbose != 0) {
        aVar12 = Abc_Clock();
        Abc_PrintTime(0x7cc46f,(char *)(aVar12 - aVar7),time);
      }
      return p_00;
    }
    uVar6 = (uint)*(undefined8 *)pGVar8;
    if ((~uVar6 & 0x1fffffff) != 0 && -1 < (int)uVar6) {
      pVVar9 = Vec_WecEntry(p_00,iVar14 - (uVar6 & 0x1fffffff));
      pVVar10 = Vec_WecEntry(p_00,iVar14 - (*(uint *)&pGVar8->field_0x4 & 0x1fffffff));
      p_01 = Vec_WecEntry(p_00,iVar14);
      Vec_IntGrow(p_01,pVVar10->nSize + pVVar9->nSize);
      piVar4 = p_01->pArray;
      piVar15 = pVVar9->pArray;
      piVar13 = pVVar10->pArray;
      piVar1 = piVar15 + pVVar9->nSize;
      piVar2 = piVar13 + pVVar10->nSize;
      uVar11 = 0;
      piVar16 = piVar4;
      while ((piVar15 < piVar1 && (piVar13 < piVar2))) {
        iVar5 = *piVar15;
        iVar3 = *piVar13;
        if (iVar5 == iVar3) {
          piVar15 = piVar15 + 1;
          *piVar16 = iVar5;
          piVar13 = piVar13 + 1;
        }
        else if (iVar5 < iVar3) {
          piVar15 = piVar15 + 1;
          *piVar16 = iVar5;
        }
        else {
          piVar13 = piVar13 + 1;
          *piVar16 = iVar3;
        }
        piVar16 = piVar16 + 1;
        uVar11 = uVar11 + 4;
      }
      for (; piVar15 < piVar1; piVar15 = piVar15 + 1) {
        *piVar16 = *piVar15;
        piVar16 = piVar16 + 1;
        uVar11 = uVar11 + 4;
      }
      for (; piVar13 < piVar2; piVar13 = piVar13 + 1) {
        *(int *)((long)piVar4 + uVar11) = *piVar13;
        uVar11 = uVar11 + 4;
      }
      iVar5 = (int)(uVar11 >> 2);
      p_01->nSize = iVar5;
      if (p_01->nCap < iVar5) {
        __assert_fail("vArr->nSize <= vArr->nCap",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x707,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
      }
      if (iVar5 < pVVar9->nSize) {
        __assert_fail("vArr->nSize >= vArr1->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x708,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
      }
      if (iVar5 < pVVar10->nSize) {
        __assert_fail("vArr->nSize >= vArr2->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x709,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
      }
    }
    iVar14 = iVar14 + 1;
  } while( true );
}

Assistant:

Vec_Wec_t * Gia_ManCreateSupps( Gia_Man_t * p, int fVerbose )
{
    abctime clk = Abc_Clock();
    Gia_Obj_t * pObj; int i, Id;
    Vec_Wec_t * vSupps = Vec_WecStart( Gia_ManObjNum(p) );
    Gia_ManForEachCiId( p, Id, i )
        Vec_IntPush( Vec_WecEntry(vSupps, Id), i );
    Gia_ManForEachAnd( p, pObj, Id )
        Vec_IntTwoMerge2( Vec_WecEntry(vSupps, Gia_ObjFaninId0(pObj, Id)), 
                          Vec_WecEntry(vSupps, Gia_ObjFaninId1(pObj, Id)), 
                          Vec_WecEntry(vSupps, Id) ); 
//    Gia_ManForEachCo( p, pObj, i )
//        Vec_IntAppend( Vec_WecEntry(vSupps, Gia_ObjId(p, pObj)), Vec_WecEntry(vSupps, Gia_ObjFaninId0p(p, pObj)) );
    if ( fVerbose )
        Abc_PrintTime( 1, "Support computation", Abc_Clock() - clk );
    return vSupps;
}